

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ic.c
# Opt level: O1

int IDAICFailFlag(IDAMem IDA_mem,int retval)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  iVar1 = -99;
  switch(retval) {
  case 1:
    msgfmt = 
    "The residual routine or the linear setup or solve routine had a recoverable error, but IDACalcIC was unable to recover."
    ;
    iVar1 = -0xe;
    error_code = -0xe;
    line = 0x2c1;
    break;
  case 2:
    msgfmt = "Unable to satisfy the inequality constraints.";
    iVar1 = -0xb;
    error_code = -0xb;
    line = 0x2c6;
    break;
  case 3:
    msgfmt = "The linesearch algorithm failed: step too small or too many backtracks.";
    iVar1 = -0xd;
    error_code = -0xd;
    line = 0x2cb;
    break;
  case 4:
    msgfmt = "Newton/Linesearch algorithm failed to converge.";
    iVar1 = -4;
    error_code = -4;
    line = 0x2d0;
    break;
  case 5:
    msgfmt = "Newton/Linesearch algorithm failed to converge.";
    iVar1 = -4;
    error_code = -4;
    line = 0x2d5;
    break;
  case -0xc:
    msgfmt = "The residual function failed at the first call. ";
    iVar1 = -0xc;
    error_code = -0xc;
    line = 0x2b2;
    break;
  case -0xb:
  case -10:
  case -9:
  case -5:
  case -4:
  case -3:
  case -2:
  case -1:
  case 0:
    goto switchD_001106a3_caseD_fffffff5;
  case -8:
    msgfmt = "The residual function failed unrecoverably. ";
    iVar1 = -8;
    error_code = -8;
    line = 0x2ad;
    break;
  case -7:
    msgfmt = "The linear solver solve failed unrecoverably.";
    iVar1 = -7;
    error_code = -7;
    line = 700;
    break;
  case -6:
    msgfmt = "The linear solver setup failed unrecoverably.";
    iVar1 = -6;
    error_code = -6;
    line = 0x2b7;
    break;
  default:
    if (retval != -0x18) {
      return -99;
    }
    msgfmt = "Some initial ewt component = 0.0 illegal.";
    iVar1 = -0x18;
    error_code = -0x18;
    line = 0x2da;
  }
  IDAProcessError(IDA_mem,error_code,line,"IDAICFailFlag",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                  ,msgfmt);
switchD_001106a3_caseD_fffffff5:
  return iVar1;
}

Assistant:

static int IDAICFailFlag(IDAMem IDA_mem, int retval)
{
  /* Depending on retval, print error message and return error flag. */
  switch (retval)
  {
  case IDA_RES_FAIL:
    IDAProcessError(IDA_mem, IDA_RES_FAIL, __LINE__, __func__, __FILE__,
                    MSG_IC_RES_NONREC);
    return (IDA_RES_FAIL);

  case IDA_FIRST_RES_FAIL:
    IDAProcessError(IDA_mem, IDA_FIRST_RES_FAIL, __LINE__, __func__, __FILE__,
                    MSG_IC_RES_FAIL);
    return (IDA_FIRST_RES_FAIL);

  case IDA_LSETUP_FAIL:
    IDAProcessError(IDA_mem, IDA_LSETUP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_IC_SETUP_FAIL);
    return (IDA_LSETUP_FAIL);

  case IDA_LSOLVE_FAIL:
    IDAProcessError(IDA_mem, IDA_LSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_IC_SOLVE_FAIL);
    return (IDA_LSOLVE_FAIL);

  case IC_FAIL_RECOV:
    IDAProcessError(IDA_mem, IDA_NO_RECOVERY, __LINE__, __func__, __FILE__,
                    MSG_IC_NO_RECOVERY);
    return (IDA_NO_RECOVERY);

  case IC_CONSTR_FAILED:
    IDAProcessError(IDA_mem, IDA_CONSTR_FAIL, __LINE__, __func__, __FILE__,
                    MSG_IC_FAIL_CONSTR);
    return (IDA_CONSTR_FAIL);

  case IC_LINESRCH_FAILED:
    IDAProcessError(IDA_mem, IDA_LINESEARCH_FAIL, __LINE__, __func__, __FILE__,
                    MSG_IC_FAILED_LINS);
    return (IDA_LINESEARCH_FAIL);

  case IC_CONV_FAIL:
    IDAProcessError(IDA_mem, IDA_CONV_FAIL, __LINE__, __func__, __FILE__,
                    MSG_IC_CONV_FAILED);
    return (IDA_CONV_FAIL);

  case IC_SLOW_CONVRG:
    IDAProcessError(IDA_mem, IDA_CONV_FAIL, __LINE__, __func__, __FILE__,
                    MSG_IC_CONV_FAILED);
    return (IDA_CONV_FAIL);

  case IDA_BAD_EWT:
    IDAProcessError(IDA_mem, IDA_BAD_EWT, __LINE__, __func__, __FILE__,
                    MSG_IC_BAD_EWT);
    return (IDA_BAD_EWT);
  }
  return -99;
}